

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O1

int __thiscall
cmake::Workflow(cmake *this,string *presetName,WorkflowListPresets listPresets,WorkflowFresh fresh)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  pointer puVar3;
  pointer pcVar4;
  size_type sVar5;
  ReadFileResult result;
  int iVar6;
  string *psVar7;
  char *pcVar8;
  iterator iVar9;
  ConfigurePreset *pCVar10;
  TestPreset *pTVar11;
  PackagePreset *pPVar12;
  BuildPreset *pBVar13;
  ostream *poVar14;
  WorkflowStep *step;
  _Alloc_hider _Var15;
  undefined8 uVar16;
  undefined8 uVar17;
  long lVar18;
  bool bVar19;
  long *plVar20;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  static_string_view type;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  static_string_view type_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  static_string_view type_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  static_string_view type_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_02;
  int stepNumber;
  vector<CalculatedStep,_std::allocator<CalculatedStep>_> steps;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  cmCMakePresetsGraph settingsFile;
  allocator_type local_321;
  int local_320;
  int local_31c;
  string local_318;
  _Any_data local_2f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e0 [2];
  undefined1 local_2c0 [16];
  unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_> local_2b0;
  pointer local_2a8;
  cmExternalMakefileProjectGeneratorFactory **local_2a0;
  pointer local_298;
  cmExternalMakefileProjectGeneratorFactory *local_290;
  char *local_288;
  _Base_ptr local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_278;
  undefined1 local_270 [16];
  _Alloc_hider local_260 [2];
  long local_250 [2];
  static_string_view local_240;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_230;
  _Alloc_hider local_220;
  WorkflowFresh local_214;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  _Alloc_hider local_1f8;
  undefined1 local_1f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::ConfigurePreset>_>_>_>
  local_1d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::BuildPreset>_>_>_>
  local_1a0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::TestPreset>_>_>_>
  local_170;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::PackagePreset>_>_>_>
  local_140;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
  local_110;
  pointer pbStack_e0;
  pointer local_d8;
  pointer pbStack_d0;
  pointer local_c8;
  pointer pbStack_c0;
  pointer local_b8;
  pointer pbStack_b0;
  pointer local_a8;
  pointer pbStack_a0;
  pointer local_98;
  pointer pbStack_90;
  pointer local_88;
  pointer pbStack_80;
  pointer local_78;
  pointer pbStack_70;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer puStack_40;
  pointer local_38;
  
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeDirectory(this,(string *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != &local_1e0) {
    operator_delete((void *)local_1f0._0_8_,
                    CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) + 1);
  }
  cmSystemTools::GetCurrentWorkingDirectory_abi_cxx11_();
  SetHomeOutputDirectory(this,(string *)local_1f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._0_8_ != &local_1e0) {
    operator_delete((void *)local_1f0._0_8_,
                    CONCAT71(local_1e0._M_allocated_capacity._1_7_,local_1e0._M_local_buf[0]) + 1);
  }
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1d0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1f0._8_8_ = 0;
  local_1e0._M_local_buf[0] = '\0';
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_1a0._M_t._M_impl.super__Rb_tree_header._M_header;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_170._M_t._M_impl.super__Rb_tree_header._M_header;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_170._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_140._M_t._M_impl.super__Rb_tree_header._M_header;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_140._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &local_110._M_impl.super__Rb_tree_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_110._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_p = (pointer)&local_58;
  local_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_88 = (pointer)0x0;
  pbStack_80 = (pointer)0x0;
  local_98 = (pointer)0x0;
  pbStack_90 = (pointer)0x0;
  local_a8 = (pointer)0x0;
  pbStack_a0 = (pointer)0x0;
  local_b8 = (pointer)0x0;
  pbStack_b0 = (pointer)0x0;
  local_c8 = (pointer)0x0;
  pbStack_c0 = (pointer)0x0;
  local_d8 = (pointer)0x0;
  pbStack_d0 = (pointer)0x0;
  local_110._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbStack_e0 = (pointer)0x0;
  local_60 = 0;
  local_58._M_local_buf[0] = '\0';
  local_48 = (pointer)0x0;
  puStack_40 = (pointer)0x0;
  local_38 = (pointer)0x0;
  local_1f0._0_8_ = &local_1e0;
  local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1d0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_1a0._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_170._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_140._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_110._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                     ((this->State)._M_t.
                      super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                      super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                      super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  result = cmCMakePresetsGraph::ReadProjectPresets((cmCMakePresetsGraph *)local_1f0,psVar7,false);
  if (result != READ_OK) {
    psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    ppcVar2 = (pointer)(psVar7->_M_dataplus)._M_p;
    puVar3 = (pointer)psVar7->_M_string_length;
    pcVar8 = cmCMakePresetsGraph::ResultToString(result);
    local_2c0._0_8_ = (pointer)0x1c;
    local_2c0._8_8_ = "Could not read presets from ";
    local_2a0 = (cmExternalMakefileProjectGeneratorFactory **)&DAT_00000002;
    local_298 = (pointer)0x78f851;
    local_2b0._M_t.
    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
    _M_t.
    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
          )(__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
            )puVar3;
    local_2a8 = ppcVar2;
    local_290 = (cmExternalMakefileProjectGeneratorFactory *)strlen(pcVar8);
    views._M_len = 4;
    views._M_array = (iterator)local_2c0;
    local_288 = pcVar8;
    cmCatViews_abi_cxx11_((string *)&local_2f0,views);
    cmSystemTools::Error((string *)&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_unused._0_8_ != local_2e0) {
      operator_delete(local_2f0._M_unused._M_object,
                      CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,local_2e0[0]._M_local_buf[0]
                              ) + 1);
    }
    iVar6 = 1;
    goto LAB_0031c88b;
  }
  if (listPresets == Yes) {
    iVar6 = 0;
    cmCMakePresetsGraph::PrintWorkflowPresetList
              ((cmCMakePresetsGraph *)local_1f0,(PrintPrecedingNewline *)0x0);
    goto LAB_0031c88b;
  }
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCMakePresetsGraph::PresetPair<cmCMakePresetsGraph::WorkflowPreset>_>_>_>
          ::find(&local_110,presetName);
  if ((_Rb_tree_header *)iVar9._M_node == p_Var1) {
    psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_2a8 = (pointer)(psVar7->_M_dataplus)._M_p;
    local_2b0._M_t.
    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
    _M_t.
    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
          )psVar7->_M_string_length;
    local_2c0._0_8_ = (pointer)0x1b;
    local_2c0._8_8_ = "No such workflow preset in ";
    local_2a0 = (cmExternalMakefileProjectGeneratorFactory **)0x3;
    local_298 = (pointer)0x79caf5;
    local_288 = (presetName->_M_dataplus)._M_p;
    local_290 = (cmExternalMakefileProjectGeneratorFactory *)presetName->_M_string_length;
    local_2f0._8_8_ = local_2e0;
    local_2f0._M_unused._0_8_ = (undefined8)&DAT_00000001;
    local_2e0[0]._M_local_buf[0] = '\"';
    local_280 = (_Base_ptr)&DAT_00000001;
    views_01._M_len = 5;
    views_01._M_array = (iterator)local_2c0;
    local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._8_8_;
    cmCatViews_abi_cxx11_(&local_318,views_01);
    cmSystemTools::Error(&local_318);
  }
  else {
    if ((char)iVar9._M_node[4]._M_color != _S_black) {
      if ((char)iVar9._M_node[0x11]._M_color == _S_red) {
        local_2a8 = (pointer)(presetName->_M_dataplus)._M_p;
        local_2b0._M_t.
        super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
        ._M_t.
        super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
        .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl =
             (__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
              )presetName->_M_string_length;
        local_2c0._0_8_ = (pointer)0x24;
        local_2c0._8_8_ = "Could not evaluate workflow preset \"";
        local_2a0 = (cmExternalMakefileProjectGeneratorFactory **)0x1a;
        local_298 = (pointer)0x75081c;
        views_02._M_len = 3;
        views_02._M_array = (iterator)local_2c0;
        cmCatViews_abi_cxx11_((string *)&local_2f0,views_02);
        cmSystemTools::Error((string *)&local_2f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._M_unused._0_8_ != local_2e0) {
          uVar16 = CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,local_2e0[0]._M_local_buf[0]);
          uVar17 = local_2f0._M_unused._0_8_;
LAB_0031c852:
          operator_delete((void *)uVar17,uVar16 + 1);
        }
      }
      else {
        if (*(char *)&iVar9._M_node[0xe]._M_left != '\0') {
          local_318._M_dataplus._M_p = (pointer)0x0;
          local_318._M_string_length = 0;
          local_318.field_2._M_allocated_capacity = 0;
          local_214 = fresh;
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::reserve
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)&local_318,
                     ((long)iVar9._M_node[0x10]._M_left - (long)iVar9._M_node[0x10]._M_parent >> 3)
                     * -0x3333333333333333);
          local_320 = 1;
          step = (WorkflowStep *)iVar9._M_node[0x10]._M_parent;
          local_1f8._M_p = (pointer)iVar9._M_node[0x10]._M_left;
          if (step != (WorkflowStep *)local_1f8._M_p) {
            local_230._M_allocated_capacity = (size_type)&local_280;
            local_230._8_8_ = local_230._M_allocated_capacity;
            local_220._M_p = (pointer)local_230._M_allocated_capacity;
            do {
              pcVar8 = local_2c0;
              iVar6 = local_320;
              switch(step->PresetType) {
              case Configure:
                type.super_string_view._M_str = "configure";
                type.super_string_view._M_len = 9;
                local_31c = local_320;
                pCVar10 = FindPresetForWorkflow<cmCMakePresetsGraph::ConfigurePreset>
                                    (this,type,&local_1d0,step);
                if (pCVar10 == (ConfigurePreset *)0x0) {
LAB_0031c871:
                  iVar6 = 1;
                  goto LAB_0031c881;
                }
                psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_2c0._0_8_ = local_2c0 + 0x10;
                pcVar4 = (psVar7->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pcVar8,pcVar4,pcVar4 + psVar7->_M_string_length);
                local_2a0 = &local_290;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"--preset","");
                local_280 = (_Base_ptr)local_270;
                pcVar4 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_280,pcVar4,pcVar4 + (step->PresetName)._M_string_length)
                ;
                __l._M_len = 3;
                __l._M_array = (iterator)pcVar8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_2f0,__l,(allocator_type *)local_210._M_local_buf);
                lVar18 = -0x60;
                plVar20 = (long *)local_270;
                do {
                  if (plVar20 != (long *)plVar20[-2]) {
                    pcVar8 = (char *)(*plVar20 + 1);
                    operator_delete((long *)plVar20[-2],(ulong)pcVar8);
                  }
                  plVar20 = plVar20 + -4;
                  lVar18 = lVar18 + 0x20;
                } while (lVar18 != 0);
                if (local_214 == Yes) {
                  pcVar8 = "--fresh";
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[8]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_2f0._M_pod_data,(char (*) [8])"--fresh");
                }
                local_210._M_allocated_capacity = 9;
                local_210._8_8_ = (long)" -T configure" + 4;
                BuildWorkflowStep((function<int_()> *)local_2c0,(cmake *)pcVar8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_2f0);
                iVar6 = local_31c;
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)&local_318,&local_320,(static_string_view *)&local_210,
                           &step->PresetName,(function<int_()> *)local_2c0);
                if (local_2b0._M_t.
                    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl !=
                    (__uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                     )0x0) {
                  (*(code *)local_2b0._M_t.
                            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
                            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)
                            ((function<int_()> *)local_2c0,(function<int_()> *)local_2c0,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_2f0);
                break;
              case Build:
                type_02.super_string_view._M_str = "build";
                type_02.super_string_view._M_len = 5;
                local_31c = local_320;
                pBVar13 = FindPresetForWorkflow<cmCMakePresetsGraph::BuildPreset>
                                    (this,type_02,&local_1a0,step);
                if (pBVar13 == (BuildPreset *)0x0) goto LAB_0031c871;
                local_240.super_string_view._M_len = 5;
                local_240.super_string_view._M_str = "build";
                psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                local_2c0._0_8_ = local_2c0 + 0x10;
                pcVar4 = (psVar7->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pcVar8,pcVar4,pcVar4 + psVar7->_M_string_length);
                local_2a0 = &local_290;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"--build","");
                local_280 = (_Base_ptr)local_270;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_280,"--preset","");
                local_260[0]._M_p = (pointer)local_250;
                pcVar4 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_260,pcVar4,pcVar4 + (step->PresetName)._M_string_length);
                __l_02._M_len = 4;
                __l_02._M_array = (iterator)pcVar8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_210,__l_02,&local_321);
                BuildWorkflowStep((function<int_()> *)&local_2f0,(cmake *)pcVar8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_210);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)&local_318,&local_320,&local_240,&step->PresetName,
                           (function<int_()> *)&local_2f0);
                if ((code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]) != (code *)0x0) {
                  (*(code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]))(&local_2f0,&local_2f0,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_210);
                lVar18 = -0x80;
                plVar20 = local_250;
                do {
                  if (plVar20 != (long *)plVar20[-2]) {
                    operator_delete((long *)plVar20[-2],*plVar20 + 1);
                  }
                  plVar20 = plVar20 + -4;
                  lVar18 = lVar18 + 0x20;
                  iVar6 = local_31c;
                } while (lVar18 != 0);
                break;
              case Test:
                type_00.super_string_view._M_str = "test";
                type_00.super_string_view._M_len = 4;
                local_31c = local_320;
                pTVar11 = FindPresetForWorkflow<cmCMakePresetsGraph::TestPreset>
                                    (this,type_00,&local_170,step);
                if (pTVar11 == (TestPreset *)0x0) goto LAB_0031c871;
                local_240.super_string_view._M_len = 4;
                local_240.super_string_view._M_str = "test";
                psVar7 = cmSystemTools::GetCTestCommand_abi_cxx11_();
                local_2c0._0_8_ = local_2c0 + 0x10;
                pcVar4 = (psVar7->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pcVar8,pcVar4,pcVar4 + psVar7->_M_string_length);
                local_2a0 = &local_290;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"--preset","");
                local_280 = (_Base_ptr)local_270;
                pcVar4 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_280,pcVar4,pcVar4 + (step->PresetName)._M_string_length)
                ;
                __l_00._M_len = 3;
                __l_00._M_array = (iterator)pcVar8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_210,__l_00,&local_321);
                BuildWorkflowStep((function<int_()> *)&local_2f0,(cmake *)pcVar8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_210);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)&local_318,&local_320,&local_240,&step->PresetName,
                           (function<int_()> *)&local_2f0);
                if ((code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]) != (code *)0x0) {
                  (*(code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]))(&local_2f0,&local_2f0,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_210);
                lVar18 = -0x60;
                plVar20 = (long *)local_270;
                do {
                  if (plVar20 != (long *)plVar20[-2]) {
                    operator_delete((long *)plVar20[-2],*plVar20 + 1);
                  }
                  plVar20 = plVar20 + -4;
                  lVar18 = lVar18 + 0x20;
                  iVar6 = local_31c;
                } while (lVar18 != 0);
                break;
              case Package:
                type_01.super_string_view._M_str = "package";
                type_01.super_string_view._M_len = 7;
                local_31c = local_320;
                pPVar12 = FindPresetForWorkflow<cmCMakePresetsGraph::PackagePreset>
                                    (this,type_01,&local_140,step);
                if (pPVar12 == (PackagePreset *)0x0) goto LAB_0031c871;
                local_240.super_string_view._M_len = 7;
                local_240.super_string_view._M_str = "package";
                psVar7 = cmSystemTools::GetCPackCommand_abi_cxx11_();
                local_2c0._0_8_ = local_2c0 + 0x10;
                pcVar4 = (psVar7->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)pcVar8,pcVar4,pcVar4 + psVar7->_M_string_length);
                local_2a0 = &local_290;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"--preset","");
                local_280 = (_Base_ptr)local_270;
                pcVar4 = (step->PresetName)._M_dataplus._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_280,pcVar4,pcVar4 + (step->PresetName)._M_string_length)
                ;
                __l_01._M_len = 3;
                __l_01._M_array = (iterator)pcVar8;
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_210,__l_01,&local_321);
                BuildWorkflowStep((function<int_()> *)&local_2f0,(cmake *)pcVar8,
                                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)&local_210);
                std::
                vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                ::
                emplace_back<int&,cm::static_string_view,std::__cxx11::string_const&,std::function<int()>>
                          ((vector<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep,std::allocator<cmake::Workflow(std::__cxx11::string_const&,cmake::WorkflowListPresets,cmake::WorkflowFresh)::CalculatedStep>>
                            *)&local_318,&local_320,&local_240,&step->PresetName,
                           (function<int_()> *)&local_2f0);
                if ((code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]) != (code *)0x0) {
                  (*(code *)CONCAT71(local_2e0[0]._M_allocated_capacity._1_7_,
                                     local_2e0[0]._M_local_buf[0]))(&local_2f0,&local_2f0,3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&local_210);
                lVar18 = -0x60;
                plVar20 = (long *)local_270;
                do {
                  if (plVar20 != (long *)plVar20[-2]) {
                    operator_delete((long *)plVar20[-2],*plVar20 + 1);
                  }
                  plVar20 = plVar20 + -4;
                  lVar18 = lVar18 + 0x20;
                  iVar6 = local_31c;
                } while (lVar18 != 0);
              }
              local_320 = iVar6 + 1;
              step = step + 1;
            } while (step != (WorkflowStep *)local_1f8._M_p);
          }
          sVar5 = local_318._M_string_length;
          if (local_318._M_dataplus._M_p == (pointer)local_318._M_string_length) {
            iVar6 = 0;
          }
          else {
            bVar19 = true;
            _Var15._M_p = local_318._M_dataplus._M_p;
            do {
              if (!bVar19) {
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
              }
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"Executing workflow step ",0x18);
              poVar14 = (ostream *)std::ostream::operator<<(&std::cout,*(int *)_Var15._M_p);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," of ",4);
              poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": ",2);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,*(char **)(_Var15._M_p + 0x10),*(long *)(_Var15._M_p + 8)
                                  );
              std::__ostream_insert<char,std::char_traits<char>>(poVar14," preset \"",9);
              poVar14 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar14,*(char **)(_Var15._M_p + 0x18),
                                   *(long *)(_Var15._M_p + 0x20));
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,"\"\n\n",3);
              std::ostream::flush();
              if (*(long *)(_Var15._M_p + 0x48) == 0) {
                std::__throw_bad_function_call();
              }
              iVar6 = (**(code **)(_Var15._M_p + 0x50))((_Any_data *)(_Var15._M_p + 0x38));
              if (iVar6 != 0) break;
              _Var15._M_p = _Var15._M_p + 0x58;
              bVar19 = false;
              iVar6 = 0;
            } while (_Var15._M_p != (pointer)sVar5);
          }
LAB_0031c881:
          std::vector<CalculatedStep,_std::allocator<CalculatedStep>_>::~vector
                    ((vector<CalculatedStep,_std::allocator<CalculatedStep>_> *)&local_318);
          goto LAB_0031c88b;
        }
        local_2c0._0_8_ = &DAT_00000027;
        local_2c0._8_8_ = "Cannot use disabled workflow preset in ";
        psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                           ((this->State)._M_t.
                            super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                            super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                            super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
        local_2f0._8_8_ = (psVar7->_M_dataplus)._M_p;
        local_2f0._M_unused._0_8_ = (undefined8)psVar7->_M_string_length;
        local_210._M_local_buf[0] = 0x22;
        cmStrCat<char[4],std::__cxx11::string,char>
                  (&local_318,(cmAlphaNum *)local_2c0,(cmAlphaNum *)&local_2f0,
                   (char (*) [4])0x79caf5,presetName,local_210._M_local_buf);
        cmSystemTools::Error(&local_318);
        uVar16 = local_318.field_2._M_allocated_capacity;
        uVar17 = local_318._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_318._M_dataplus._M_p != &local_318.field_2) goto LAB_0031c852;
      }
      iVar6 = 1;
      cmCMakePresetsGraph::PrintWorkflowPresetList
                ((cmCMakePresetsGraph *)local_1f0,(PrintPrecedingNewline *)0x0);
      goto LAB_0031c88b;
    }
    psVar7 = cmState::GetSourceDirectory_abi_cxx11_
                       ((this->State)._M_t.
                        super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                        super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                        super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
    local_2a8 = (pointer)(psVar7->_M_dataplus)._M_p;
    local_2b0._M_t.
    super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>.
    _M_t.
    super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
    .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>,_true,_true>
          )psVar7->_M_string_length;
    local_2c0._0_8_ = (pointer)0x25;
    local_2c0._8_8_ = "Cannot use hidden workflow preset in ";
    local_2a0 = (cmExternalMakefileProjectGeneratorFactory **)0x3;
    local_298 = (pointer)0x79caf5;
    local_288 = (presetName->_M_dataplus)._M_p;
    local_290 = (cmExternalMakefileProjectGeneratorFactory *)presetName->_M_string_length;
    local_2f0._8_8_ = local_2e0;
    local_2f0._M_unused._0_8_ = (undefined8)&DAT_00000001;
    local_2e0[0]._M_local_buf[0] = '\"';
    local_280 = (_Base_ptr)&DAT_00000001;
    views_00._M_len = 5;
    views_00._M_array = (iterator)local_2c0;
    local_278 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._8_8_;
    cmCatViews_abi_cxx11_(&local_318,views_00);
    cmSystemTools::Error(&local_318);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_318._M_dataplus._M_p != &local_318.field_2) {
    operator_delete(local_318._M_dataplus._M_p,local_318.field_2._M_allocated_capacity + 1);
  }
  iVar6 = 1;
  cmCMakePresetsGraph::PrintWorkflowPresetList
            ((cmCMakePresetsGraph *)local_1f0,(PrintPrecedingNewline *)0x0);
LAB_0031c88b:
  cmCMakePresetsGraph::~cmCMakePresetsGraph((cmCMakePresetsGraph *)local_1f0);
  return iVar6;
}

Assistant:

int cmake::Workflow(const std::string& presetName,
                    WorkflowListPresets listPresets, WorkflowFresh fresh)
{
#ifndef CMAKE_BOOTSTRAP
  this->SetHomeDirectory(cmSystemTools::GetCurrentWorkingDirectory());
  this->SetHomeOutputDirectory(cmSystemTools::GetCurrentWorkingDirectory());

  cmCMakePresetsGraph settingsFile;
  auto result = settingsFile.ReadProjectPresets(this->GetHomeDirectory());
  if (result != cmCMakePresetsGraph::ReadFileResult::READ_OK) {
    cmSystemTools::Error(
      cmStrCat("Could not read presets from ", this->GetHomeDirectory(), ": ",
               cmCMakePresetsGraph::ResultToString(result)));
    return 1;
  }

  if (listPresets == WorkflowListPresets::Yes) {
    settingsFile.PrintWorkflowPresetList();
    return 0;
  }

  auto presetPair = settingsFile.WorkflowPresets.find(presetName);
  if (presetPair == settingsFile.WorkflowPresets.end()) {
    cmSystemTools::Error(cmStrCat("No such workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (presetPair->second.Unexpanded.Hidden) {
    cmSystemTools::Error(cmStrCat("Cannot use hidden workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  auto const& expandedPreset = presetPair->second.Expanded;
  if (!expandedPreset) {
    cmSystemTools::Error(cmStrCat("Could not evaluate workflow preset \"",
                                  presetName, "\": Invalid macro expansion"));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  if (!expandedPreset->ConditionResult) {
    cmSystemTools::Error(cmStrCat("Cannot use disabled workflow preset in ",
                                  this->GetHomeDirectory(), ": \"", presetName,
                                  '"'));
    settingsFile.PrintWorkflowPresetList();
    return 1;
  }

  struct CalculatedStep
  {
    int StepNumber;
    cm::static_string_view Type;
    std::string Name;
    std::function<int()> Action;

    CalculatedStep(int stepNumber, cm::static_string_view type,
                   std::string name, std::function<int()> action)
      : StepNumber(stepNumber)
      , Type(type)
      , Name(std::move(name))
      , Action(std::move(action))
    {
    }
  };

  std::vector<CalculatedStep> steps;
  steps.reserve(expandedPreset->Steps.size());
  int stepNumber = 1;
  for (auto const& step : expandedPreset->Steps) {
    switch (step.PresetType) {
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::
        Configure: {
        auto const* configurePreset = this->FindPresetForWorkflow(
          "configure"_s, settingsFile.ConfigurePresets, step);
        if (!configurePreset) {
          return 1;
        }
        std::vector<std::string> args{ cmSystemTools::GetCMakeCommand(),
                                       "--preset", step.PresetName };
        if (fresh == WorkflowFresh::Yes) {
          args.emplace_back("--fresh");
        }
        steps.emplace_back(stepNumber, "configure"_s, step.PresetName,
                           this->BuildWorkflowStep(args));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Build: {
        auto const* buildPreset = this->FindPresetForWorkflow(
          "build"_s, settingsFile.BuildPresets, step);
        if (!buildPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "build"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCMakeCommand(),
                                    "--build", "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Test: {
        auto const* testPreset = this->FindPresetForWorkflow(
          "test"_s, settingsFile.TestPresets, step);
        if (!testPreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "test"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCTestCommand(),
                                    "--preset", step.PresetName }));
      } break;
      case cmCMakePresetsGraph::WorkflowPreset::WorkflowStep::Type::Package: {
        auto const* packagePreset = this->FindPresetForWorkflow(
          "package"_s, settingsFile.PackagePresets, step);
        if (!packagePreset) {
          return 1;
        }
        steps.emplace_back(
          stepNumber, "package"_s, step.PresetName,
          this->BuildWorkflowStep({ cmSystemTools::GetCPackCommand(),
                                    "--preset", step.PresetName }));
      } break;
    }
    stepNumber++;
  }

  int stepResult;
  bool first = true;
  for (auto const& step : steps) {
    if (!first) {
      std::cout << "\n";
    }
    std::cout << "Executing workflow step " << step.StepNumber << " of "
              << steps.size() << ": " << step.Type << " preset \"" << step.Name
              << "\"\n\n"
              << std::flush;
    if ((stepResult = step.Action()) != 0) {
      return stepResult;
    }
    first = false;
  }
#endif

  return 0;
}